

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<QPoint>::insert
          (QPodArrayOps<QPoint> *this,qsizetype i,qsizetype n,parameter_type t)

{
  long lVar1;
  QPoint QVar2;
  QPoint *pQVar3;
  QPoint *in_RCX;
  long in_RDX;
  QArrayDataPointer<QPoint> *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QPoint *where;
  GrowthPosition pos;
  QPoint copy;
  QArrayDataPointer<QPoint> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QVar2 = *in_RCX;
  uVar4 = 0;
  if ((*(long *)(in_RDI + 0x10) != 0) && (in_RSI == (QArrayDataPointer<QPoint> *)0x0)) {
    uVar4 = 1;
  }
  QArrayDataPointer<QPoint>::detachAndGrow
            (in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20),(qsizetype)in_RCX,
             (QPoint **)CONCAT44(uVar4,in_stack_ffffffffffffffc8),in_stack_ffffffffffffffc0);
  pQVar3 = createHole((QPodArrayOps<QPoint> *)in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20),
                      (qsizetype)in_RCX,CONCAT44(uVar4,in_stack_ffffffffffffffc8));
  while (in_RDX != 0) {
    *pQVar3 = QVar2;
    pQVar3 = pQVar3 + 1;
    in_RDX = in_RDX + -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        typename Data::GrowthPosition pos = Data::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = Data::GrowsAtBeginning;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        T *where = createHole(pos, i, n);
        while (n--)
            *where++ = copy;
    }